

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O2

void __thiscall
iDynTree::ConvexHullProjectionConstraint::buildConstraintMatrix
          (ConvexHullProjectionConstraint *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pVVar5;
  pointer pVVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  size_t i;
  ulong uVar10;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  iDynTree::MatrixDynSize::resize
            ((ulong)&this->A,
             (long)(this->projectedConvexHull).m_vertices.
                   super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->projectedConvexHull).m_vertices.
                   super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  iDynTree::VectorDynSize::resize((ulong)&this->b);
  lVar9 = 0x10;
  uVar10 = 0;
  while( true ) {
    pVVar5 = (this->projectedConvexHull).m_vertices.
             super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)(this->projectedConvexHull).m_vertices.
                  super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 4;
    if (uVar8 <= uVar10) break;
    dVar1 = *(double *)((long)pVVar5[-1].m_data + lVar9);
    pVVar6 = pVVar5;
    if (uVar10 != uVar8 - 1) {
      pVVar6 = (pointer)((long)pVVar5->m_data + lVar9);
    }
    dVar2 = *(double *)((long)pVVar5->m_data + lVar9 + -8);
    dVar3 = pVVar6->m_data[1];
    dVar4 = pVVar6->m_data[0];
    toEigen(&local_50,&this->A);
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data[local_50.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value * uVar10] = dVar3 - dVar2;
    (local_50.
     super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
     .
     super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
     .m_data +
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value * uVar10)[1] = dVar1 - dVar4;
    pdVar7 = (double *)iDynTree::VectorDynSize::operator()(&this->b,uVar10);
    *pdVar7 = dVar1 * dVar3 - dVar2 * dVar4;
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 0x10;
  }
  return;
}

Assistant:

void ConvexHullProjectionConstraint::buildConstraintMatrix()
    {
        // The rows of the A matrix and of the b vector depends on the number of vertices in the convex hull
        A.resize(projectedConvexHull.getNrOfVertices(),2);
        b.resize(projectedConvexHull.getNrOfVertices());

        // We assume that the vertices in projectedConvexHull are expressed in counter-clockwise order: this
        // is ensured by the structure of the Monotone Chain algorithm

        // Iterate on all line segments one by one
        for (size_t i=0; i < projectedConvexHull.getNrOfVertices(); i++)
        {
            Vector2 p0 = projectedConvexHull(i);
            Vector2 p1;

            if ( i != projectedConvexHull.getNrOfVertices()-1 )
            {
                p1 = projectedConvexHull(i+1);
            }
            else
            {
                // if we are using the last vertix, we build the line connecting it with the first vertex
                p1 = projectedConvexHull(0);
            }

            toEigen(A).block<1,2>(i,0) = Eigen::Vector2d(p1(1)-p0(1),p0(0)-p1(0));
            b(i) = p0(0)*p1(1) - p1(0)*p0(1);
        }

        return;
    }